

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  CacheEntryType type_1;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  string *local_40;
  CacheEntryType local_34;
  
  local_40 = value;
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar7 != 0)) {
    ParseCacheEntry::reg.regmatch.startp[0] = (char *)0x0;
    ParseCacheEntry::reg.regmatch.endp[0] = (char *)0x0;
    ParseCacheEntry::reg.regmatch.searchstring = (char *)0x0;
    ParseCacheEntry::reg.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar7 != 0)) {
    ParseCacheEntry::regQuoted.regmatch.startp[0] = (char *)0x0;
    ParseCacheEntry::regQuoted.regmatch.endp[0] = (char *)0x0;
    ParseCacheEntry::regQuoted.regmatch.searchstring = (char *)0x0;
    ParseCacheEntry::regQuoted.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  bVar6 = cmsys::RegularExpression::find
                    (&ParseCacheEntry::regQuoted,(entry->_M_dataplus)._M_p,
                     &ParseCacheEntry::regQuoted.regmatch);
  if (bVar6) {
    if (ParseCacheEntry::regQuoted.regmatch.startp[1] == (char *)0x0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,ParseCacheEntry::regQuoted.regmatch.startp[1],
                 ParseCacheEntry::regQuoted.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    local_60 = &local_50;
    if (ParseCacheEntry::regQuoted.regmatch.startp[2] == (char *)0x0) {
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,ParseCacheEntry::regQuoted.regmatch.startp[2],
                 ParseCacheEntry::regQuoted.regmatch.endp[2]);
    }
    pcVar5 = local_60;
    local_34 = STRING;
    StringToCacheEntryType(local_60,&local_34);
    *type = local_34;
    pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
    pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    if (pcVar5 != &local_50) {
      operator_delete(pcVar5,CONCAT71(uStack_4f,local_50) + 1);
      pcVar1 = ParseCacheEntry::regQuoted.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::regQuoted.regmatch.endp[3];
    }
joined_r0x001b4e0b:
    if (pcVar1 == (char *)0x0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar1,pcVar2);
    }
    psVar8 = local_40;
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    bVar6 = true;
  }
  else {
    bVar6 = cmsys::RegularExpression::find
                      (&ParseCacheEntry::reg,(entry->_M_dataplus)._M_p,
                       &ParseCacheEntry::reg.regmatch);
    if (bVar6) {
      local_60 = &local_50;
      if (ParseCacheEntry::reg.regmatch.startp[1] == (char *)0x0) {
        local_58 = 0;
        local_50 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,ParseCacheEntry::reg.regmatch.startp[1],
                   ParseCacheEntry::reg.regmatch.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_60);
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
      if (ParseCacheEntry::reg.regmatch.startp[2] == (char *)0x0) {
        local_58 = 0;
        local_50 = '\0';
        local_60 = &local_50;
      }
      else {
        local_60 = &local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,ParseCacheEntry::reg.regmatch.startp[2],
                   ParseCacheEntry::reg.regmatch.endp[2]);
      }
      pcVar5 = local_60;
      local_34 = STRING;
      StringToCacheEntryType(local_60,&local_34);
      *type = local_34;
      pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
      pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      if (pcVar5 != &local_50) {
        operator_delete(pcVar5,CONCAT71(uStack_4f,local_50) + 1);
        pcVar1 = ParseCacheEntry::reg.regmatch.startp[3];
        pcVar2 = ParseCacheEntry::reg.regmatch.endp[3];
      }
      goto joined_r0x001b4e0b;
    }
    bVar6 = false;
    psVar8 = local_40;
  }
  if (bVar6) {
    if (((1 < psVar8->_M_string_length) && (pcVar1 = (psVar8->_M_dataplus)._M_p, *pcVar1 == '\''))
       && (pcVar1[psVar8->_M_string_length - 1] == '\'')) {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)psVar8);
      std::__cxx11::string::operator=((string *)psVar8,(string *)&local_60);
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
    }
    if (bVar6) {
      return true;
    }
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::reg == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::reg), iVar7 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._0_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._80_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._160_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._192_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::regQuoted == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::regQuoted), iVar7 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._0_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._80_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._160_8_ = 0;
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._192_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted);
  }
  bVar6 = cmsys::RegularExpression::find
                    ((RegularExpression *)
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted,(entry->_M_dataplus)._M_p,
                     (RegularExpressionMatch *)
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted);
  if (bVar6) {
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::regQuoted._8_8_ == 0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._88_8_);
    }
    psVar8 = local_40;
    std::__cxx11::string::operator=((string *)var,(string *)&local_60);
    lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._16_8_;
    uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._96_8_;
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
    }
  }
  else {
    bVar6 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::reg,(entry->_M_dataplus)._M_p,
                       (RegularExpressionMatch *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::reg);
    psVar8 = local_40;
    if (!bVar6) {
      bVar6 = false;
      goto LAB_001b5065;
    }
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::reg._8_8_ == 0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._88_8_);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_60);
    lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._16_8_;
    uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._96_8_;
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      lVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      uVar4 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
    }
  }
  if (lVar3 == 0) {
    local_60 = &local_50;
    local_58 = 0;
    local_50 = '\0';
  }
  else {
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,lVar3,uVar4);
  }
  std::__cxx11::string::operator=((string *)psVar8,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  bVar6 = true;
LAB_001b5065:
  if ((((bVar6 != false) && (1 < psVar8->_M_string_length)) &&
      (pcVar1 = (psVar8->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[psVar8->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)psVar8);
    std::__cxx11::string::operator=((string *)psVar8,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  return bVar6;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}